

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_calc_gv(HTS_PStream *pst,size_t m,double *mean,double *vari)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t t;
  double *vari_local;
  double *mean_local;
  size_t m_local;
  HTS_PStream *pst_local;
  
  *mean = 0.0;
  for (t = 0; t < pst->length; t = t + 1) {
    if (pst->gv_switch[t] != '\0') {
      *mean = pst->par[t][m] + *mean;
    }
  }
  sVar1 = pst->gv_length;
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  *mean = *mean / ((auVar2._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  *vari = 0.0;
  for (t = 0; t < pst->length; t = t + 1) {
    if (pst->gv_switch[t] != '\0') {
      *vari = (pst->par[t][m] - *mean) * (pst->par[t][m] - *mean) + *vari;
    }
  }
  sVar1 = pst->gv_length;
  auVar3._8_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1;
  auVar3._12_4_ = 0x45300000;
  *vari = *vari / ((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  return;
}

Assistant:

static void HTS_PStream_calc_gv(HTS_PStream * pst, size_t m, double *mean, double *vari)
{
   size_t t;

   *mean = 0.0;
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         *mean += pst->par[t][m];
   *mean /= pst->gv_length;
   *vari = 0.0;
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         *vari += (pst->par[t][m] - *mean) * (pst->par[t][m] - *mean);
   *vari /= pst->gv_length;
}